

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O2

void __thiscall eglu::BadAllocError::BadAllocError(BadAllocError *this,char *errStr)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,errStr,&local_31);
  tcu::ResourceError::ResourceError(&this->super_ResourceError,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__Exception_01e110e0;
  return;
}

Assistant:

BadAllocError::BadAllocError (const char* errStr)
	: tcu::ResourceError(errStr)
{
}